

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableObjectWalker::Get
          (RecyclableObjectWalker *this,int index,ResolvedObject *pResolvedObject)

{
  PropertyId _propId;
  Var _parentObj;
  Var _value;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Type *ppIVar7;
  Type *ppDVar8;
  char16 *pcVar9;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar10;
  RecyclableObjectAddress *this_00;
  int local_b0;
  int local_a8;
  int local_a4;
  TrackAllocData local_88;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  DebuggerPropertyDisplayInfo *displayInfo;
  int local_48;
  int nonArrayElementCount;
  int arrayItemCount;
  int fakeObjCount;
  ResolvedObject *pResolvedObject_local;
  RecyclableObjectWalker *pRStack_30;
  int index_local;
  RecyclableObjectWalker *this_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  _arrayItemCount = pResolvedObject;
  pResolvedObject_local._4_4_ = index;
  pRStack_30 = this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x8ea,"(pResolvedObject)",
                                "Bad usage of RecyclableObjectWalker::Get");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->fakeGroupObjectWalkerList ==
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_a4 = 0;
  }
  else {
    local_a4 = JsUtil::
               ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
               ::Count(&this->fakeGroupObjectWalkerList->
                        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                      );
  }
  nonArrayElementCount = local_a4;
  if (this->innerArrayObjectWalker == (RecyclableArrayWalker *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
                 super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  iVar2 = pResolvedObject_local._4_4_;
  local_48 = local_a8;
  if ((((int)pResolvedObject_local._4_4_ < 0) ||
      (this->pMembersList ==
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0)) ||
     (iVar4 = JsUtil::
              ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ::Count(&this->pMembersList->
                       super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), iVar4 + local_48 + nonArrayElementCount <= iVar2)) {
    this_local._4_4_ = 0;
  }
  else {
    bVar3 = VarIs<Js::RecyclableObject>(this->instance);
    if (bVar3) {
      local_b0 = JsUtil::
                 ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                 ::Count(&this->pMembersList->
                          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                        );
    }
    else {
      local_b0 = 0;
    }
    displayInfo._4_4_ = local_b0;
    if ((int)pResolvedObject_local._4_4_ < nonArrayElementCount) {
      if (this->fakeGroupObjectWalkerList ==
          (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x8f9,"(fakeGroupObjectWalkerList)","fakeGroupObjectWalkerList"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      ppIVar7 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->fakeGroupObjectWalkerList,pResolvedObject_local._4_4_);
      this_local._4_4_ =
           (*(*ppIVar7)->_vptr_IDiagObjectModelWalkerBase[2])(*ppIVar7,_arrayItemCount);
    }
    else {
      pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - nonArrayElementCount;
      if ((int)pResolvedObject_local._4_4_ < local_b0) {
        bVar3 = VarIs<Js::RecyclableObject>(this->instance);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x901,"(Js::VarIs<Js::RecyclableObject>(instance))",
                                      "Js::VarIs<Js::RecyclableObject>(instance)");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        ppDVar8 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->pMembersList,pResolvedObject_local._4_4_);
        _arrayItemCount->propId = (*ppDVar8)->propId;
        if ((_arrayItemCount->propId == -1) ||
           (BVar5 = IsInternalPropertyId(_arrayItemCount->propId), BVar5 != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x907,"(0)","FALSE");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          this_local._4_4_ = 0;
        }
        else {
          ppDVar8 = JsUtil::
                    List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->pMembersList,pResolvedObject_local._4_4_);
          propertyRecord = (PropertyRecord *)*ppDVar8;
          local_60 = ScriptContext::GetPropertyName(this->scriptContext,_arrayItemCount->propId);
          pcVar9 = PropertyRecord::GetBuffer(local_60);
          _arrayItemCount->name = pcVar9;
          _arrayItemCount->obj = *(Var *)&propertyRecord->pid;
          if (_arrayItemCount->obj == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x910,"(pResolvedObject->obj)","pResolvedObject->obj");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          _arrayItemCount->scriptContext = this->scriptContext;
          local_20 = _arrayItemCount->obj;
          if (local_20 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          bVar3 = TaggedInt::Is(local_20);
          if (bVar3) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
            if (bVar3) {
              local_18 = TypeIds_Number;
            }
            else {
              pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
              if (pRStack_10 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              local_14 = RecyclableObject::GetTypeId(pRStack_10);
              if ((0x57 < (int)local_14) &&
                 (BVar5 = RecyclableObject::IsExternal(pRStack_10), BVar5 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              local_18 = local_14;
            }
          }
          _arrayItemCount->typeId = local_18;
          pAVar10 = &GetArenaFromContext(this->scriptContext)->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_88,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x91a);
          pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo(pAVar10,&local_88);
          this_00 = (RecyclableObjectAddress *)
                    new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
          _parentObj = this->instance;
          _propId = _arrayItemCount->propId;
          _value = _arrayItemCount->obj;
          bVar3 = DebuggerPropertyDisplayInfo::IsInDeadZone
                            ((DebuggerPropertyDisplayInfo *)propertyRecord);
          RecyclableObjectAddress::RecyclableObjectAddress
                    (this_00,_parentObj,_propId,_value,(uint)bVar3);
          _arrayItemCount->address = (IDiagObjectAddress *)this_00;
          bVar3 = DebuggerPropertyDisplayInfo::IsConst
                            ((DebuggerPropertyDisplayInfo *)propertyRecord);
          _arrayItemCount->isConst = bVar3;
          this_local._4_4_ = 1;
        }
      }
      else {
        pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - local_b0;
        if ((int)pResolvedObject_local._4_4_ < local_48) {
          if (this->innerArrayObjectWalker == (RecyclableArrayWalker *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x925,"(innerArrayObjectWalker)","innerArrayObjectWalker");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          this_local._4_4_ =
               (**(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
                  super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase)
                         (this->innerArrayObjectWalker,(ulong)pResolvedObject_local._4_4_,
                          _arrayItemCount);
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x929,"(false)","false");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL RecyclableObjectWalker::Get(int index, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableObjectWalker::Get");

        int fakeObjCount = fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0;
        int arrayItemCount = innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0;

        if (index < 0 || !pMembersList || index >= (pMembersList->Count() + arrayItemCount + fakeObjCount))
        {
            return FALSE;
        }

        int nonArrayElementCount = Js::VarIs<Js::RecyclableObject>(instance) ? pMembersList->Count() : 0;

        // First the virtual groups
        if (index < fakeObjCount)
        {
            Assert(fakeGroupObjectWalkerList);
            return fakeGroupObjectWalkerList->Item(index)->GetGroupObject(pResolvedObject);
        }

        index -= fakeObjCount;

        if (index < nonArrayElementCount)
        {
            Assert(Js::VarIs<Js::RecyclableObject>(instance));

            pResolvedObject->propId = pMembersList->Item(index)->propId;

            if (pResolvedObject->propId == Js::Constants::NoProperty || Js::IsInternalPropertyId(pResolvedObject->propId))
            {
                Assert(FALSE);
                return FALSE;
            }

            Js::DebuggerPropertyDisplayInfo* displayInfo = pMembersList->Item(index);
            const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(pResolvedObject->propId);

            pResolvedObject->name = propertyRecord->GetBuffer();
            pResolvedObject->obj = displayInfo->aVar;
            Assert(pResolvedObject->obj);

            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                RecyclableObjectAddress,
                instance,
                pResolvedObject->propId,
                pResolvedObject->obj,
                displayInfo->IsInDeadZone() ? TRUE : FALSE);

            pResolvedObject->isConst = displayInfo->IsConst();

            return TRUE;
        }

        index -= nonArrayElementCount;

        if (index < arrayItemCount)
        {
            Assert(innerArrayObjectWalker);
            return innerArrayObjectWalker->Get(index, pResolvedObject);
        }

        Assert(false);
        return FALSE;
    }